

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O3

FT_Error BDF_Face_Init(FT_Stream stream,FT_Face bdfface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  char cVar1;
  short sVar2;
  short sVar3;
  unsigned_long cur_count;
  FT_Memory memory;
  bdf_font_t *font;
  FT_Face pFVar4;
  void *__src;
  bdf_glyph_t *pbVar5;
  long lVar6;
  FT_Short FVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  FT_Error FVar11;
  ulong *puVar12;
  undefined1 *block;
  FT_ULong FVar13;
  bdf_property_t *pbVar14;
  FT_String *pFVar15;
  char *pcVar16;
  size_t sVar17;
  size_t sVar18;
  FT_Bitmap_Size *pFVar19;
  FT_Pointer pvVar20;
  bdf_property_t *pbVar21;
  byte *pbVar22;
  long lVar23;
  anon_union_8_3_ccdffb78_for_value *paVar24;
  undefined2 *puVar25;
  ushort uVar26;
  long lVar27;
  ushort uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  FT_Memory memory_00;
  FT_Long FVar33;
  long *plVar34;
  bdf_font_t *font_00;
  bool bVar35;
  FT_Error error;
  _bdf_line_func_t cb;
  FT_Error local_e4;
  FT_Error local_e0;
  FT_Int local_dc;
  ulong *local_d8;
  undefined1 *local_d0;
  undefined1 local_c8 [8];
  char *pcStack_c0;
  char *local_b8;
  char *pcStack_b0;
  FT_Memory local_a8;
  FT_Memory local_a0;
  long local_98;
  ulong local_90;
  size_t local_88 [5];
  FT_ULong local_60;
  size_t local_58;
  long local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  memory_00 = bdfface->memory;
  local_e0 = FT_Stream_Seek(stream,0);
  if (local_e0 != 0) {
    return local_e0;
  }
  local_48 = 0x100000001;
  uStack_40 = 0x800000000;
  local_e4 = 0;
  puVar12 = (ulong *)ft_mem_alloc(memory_00,0x44078,&local_e4);
  if (local_e4 == 0) {
    puVar12[8] = (ulong)&local_48;
    *(undefined2 *)(puVar12 + 3) = 0x7fff;
    puVar12[0x880e] = stream->size;
    puVar12[0x880d] = (ulong)memory_00;
    puVar12[0x8809] = 0;
    puVar12[0x880a] = 0;
    puVar12[0x880b] = 0;
    puVar12[0x880c] = (ulong)memory_00;
    local_a0 = stream->memory;
    local_88[0] = local_88[0] & 0xffffffff00000000;
    uVar29 = 0x400;
    local_d8 = puVar12;
    local_a8 = memory_00;
    block = (undefined1 *)ft_mem_realloc(local_a0,1,0,0x400,(void *)0x0,(FT_Error *)local_88);
    if ((int)local_88[0] == 0) {
      local_98 = 1;
      local_c8 = (undefined1  [8])_bdf_parse_start;
      *block = 0;
      FVar13 = 0;
      lVar32 = 0;
      sVar17 = 0;
      iVar10 = 0x100;
      local_dc = face_index;
      uVar30 = uVar29;
LAB_0013aaa6:
      do {
        local_90 = uVar30;
        local_d0 = block;
        bVar35 = false;
        lVar23 = 0;
        block = local_d0;
        while( true ) {
          if (!bVar35) {
            FVar13 = FT_Stream_TryRead(stream,block + sVar17,uVar29 - sVar17);
            lVar32 = FVar13 + sVar17;
            sVar17 = 0;
            block = local_d0;
          }
          lVar6 = local_98;
          face_index = local_dc;
          sVar18 = lVar32 - lVar23;
          uVar30 = uVar29;
          if (sVar18 == 0 || lVar32 < lVar23) break;
          if (iVar10 == (char)block[lVar23]) {
            lVar23 = lVar23 + 1;
            iVar10 = 0x100;
            bVar35 = true;
          }
          else {
            pcVar16 = block + lVar23;
            lVar31 = 0;
            lVar27 = lVar23;
            while ((cVar1 = block[lVar27], cVar1 != '\n' && (cVar1 != '\r'))) {
              lVar27 = lVar27 + 1;
              lVar31 = lVar31 + 1;
              uVar30 = local_90;
              if (lVar32 <= lVar27) goto LAB_0013ac06;
            }
            block[lVar27] = 0;
            if (((*pcVar16 != '\x1a') && (*pcVar16 != '#')) && (lVar23 < lVar27)) {
              local_60 = FVar13;
              local_58 = sVar17;
              local_50 = lVar32;
              iVar10 = (*(code *)local_c8)(pcVar16,lVar31,local_98,local_c8,local_d8);
              local_88[0] = CONCAT44(local_88[0]._4_4_,iVar10);
              if (iVar10 == -1) {
                iVar10 = (*(code *)local_c8)(pcVar16,lVar31,lVar6,local_c8,local_d8);
                local_88[0] = CONCAT44(local_88[0]._4_4_,iVar10);
              }
              FVar13 = local_60;
              lVar32 = local_50;
              block = local_d0;
              sVar17 = local_58;
              face_index = local_dc;
              if (iVar10 != 0) goto LAB_0013ac97;
            }
            local_98 = local_98 + 1;
            block[lVar27] = cVar1;
            lVar23 = lVar27 + 1;
            iVar10 = 0x100;
            if (cVar1 == '\r') {
              iVar10 = 10;
            }
            if (cVar1 == '\n') {
              iVar10 = 0xd;
            }
            bVar35 = true;
            uVar29 = local_90;
          }
        }
LAB_0013ac06:
        if (FVar13 == 0) break;
        if (lVar23 != 0) {
          memmove(block,block + lVar23,sVar18);
          FVar13 = sVar18;
          lVar32 = lVar23;
          sVar17 = sVar18;
          uVar29 = uVar30;
          block = local_d0;
          uVar30 = local_90;
          goto LAB_0013aaa6;
        }
        if (0xffff < uVar30) {
          local_88[0] = CONCAT44(local_88[0]._4_4_,6);
          break;
        }
        uVar29 = uVar30 * 2;
        local_d0 = (undefined1 *)CONCAT44(local_d0._4_4_,iVar10);
        block = (undefined1 *)ft_mem_realloc(local_a0,1,uVar30,uVar29,block,(FT_Error *)local_88);
        sVar17 = uVar30;
        iVar10 = (int)local_d0;
        uVar30 = uVar29;
      } while ((int)local_88[0] == 0);
    }
LAB_0013ac97:
    ft_mem_free(local_a0,block);
    memory_00 = local_a8;
    local_e4 = (int)local_88[0];
    font_00 = (bdf_font_t *)local_d8[7];
    if ((int)local_88[0] == 0) {
      puVar12 = local_d8;
      if (font_00 == (bdf_font_t *)0x0) {
        uVar29 = *local_d8;
        if ((uVar29 & 1) != 0) goto LAB_0013b2ec;
        local_e4 = 3;
        goto LAB_0013ace6;
      }
      if (font_00->spacing != 8) {
        font_00->monowidth = (font_00->bbx).width;
      }
      if (local_d8[1] != font_00->unencoded_used + font_00->glyphs_used) {
        font_00->modified = 1;
      }
      if ((font_00->unencoded_used != 0 || font_00->glyphs_used != 0) && (*(int *)local_d8[8] != 0))
      {
        sVar2 = (short)local_d8[3];
        uVar8 = (int)*(short *)((long)local_d8 + 0x1c) - (int)sVar2;
        if (uVar8 != (font_00->bbx).width) {
          (font_00->bbx).width = (unsigned_short)uVar8;
          font_00->modified = 1;
        }
        if ((font_00->bbx).x_offset != sVar2) {
          (font_00->bbx).x_offset = sVar2;
          font_00->modified = 1;
        }
        sVar2 = *(short *)((long)local_d8 + 0x1e);
        if ((font_00->bbx).ascent != sVar2) {
          (font_00->bbx).ascent = sVar2;
          font_00->modified = 1;
        }
        sVar3 = (short)local_d8[4];
        if ((font_00->bbx).descent != sVar3) {
          (font_00->bbx).descent = sVar3;
          (font_00->bbx).y_offset = -sVar3;
          font_00->modified = 1;
        }
        if ((int)sVar3 + (int)sVar2 != (uint)(font_00->bbx).height) {
          (font_00->bbx).height = (unsigned_short)((int)sVar3 + (int)sVar2);
        }
      }
      uVar29 = *local_d8;
      if ((uVar29 & 1) != 0) {
LAB_0013b2ec:
        if ((uVar29 & 0x20) == 0) {
          local_e4 = 0xb9;
        }
        else {
          local_e4 = 0xba;
        }
        goto LAB_0013acc2;
      }
      cur_count = font_00->comments_len;
      if (cur_count != 0) {
        pcVar16 = (char *)ft_mem_realloc(font_00->memory,1,cur_count,cur_count + 1,font_00->comments
                                         ,&local_e4);
        font_00 = (bdf_font_t *)local_d8[7];
        font_00->comments = pcVar16;
        if (local_e4 != 0) goto LAB_0013acc2;
        pcVar16[font_00->comments_len] = '\0';
        font_00 = (bdf_font_t *)local_d8[7];
        puVar12 = local_d8;
      }
    }
    else {
LAB_0013acc2:
      bdf_free_font(font_00);
      puVar12 = local_d8;
      ft_mem_free(memory_00,(void *)local_d8[7]);
      puVar12[7] = 0;
LAB_0013ace6:
      font_00 = (bdf_font_t *)0x0;
    }
LAB_0013ace9:
    if ((FT_Memory)puVar12[0x880c] != (FT_Memory)0x0) {
      ft_mem_free((FT_Memory)puVar12[0x880c],(void *)puVar12[0x8809]);
      puVar12[0x880b] = 0;
      puVar12[0x880c] = 0;
      puVar12[0x8809] = 0;
      puVar12[0x880a] = 0;
    }
    ft_mem_free(memory_00,(void *)puVar12[5]);
    puVar12[5] = 0;
    ft_mem_free(memory_00,puVar12);
  }
  else {
    font_00 = (bdf_font_t *)0x0;
    if (puVar12 != (ulong *)0x0) goto LAB_0013ace9;
  }
  local_e0 = local_e4;
  if ((char)local_e4 == -0x50) {
    BDF_Face_Done(bdfface);
    return 2;
  }
  if (local_e4 != 0) {
    return local_e4;
  }
  bdfface[1].face_flags = (FT_Long)font_00;
  if ((short)face_index != 0 && 0 < face_index) {
    BDF_Face_Done(bdfface);
    return 6;
  }
  bdfface->num_faces = 1;
  bdfface->face_index = 0;
  *(byte *)&bdfface->face_flags = (byte)bdfface->face_flags | 0x92;
  pbVar14 = bdf_get_font_property(font_00,"SPACING");
  if (((pbVar14 != (bdf_property_t *)0x0) && (pbVar14->format == 1)) &&
     (((byte *)(pbVar14->value).atom != (byte *)0x0 &&
      ((uVar8 = (byte)*(pbVar14->value).atom - 0x43, uVar8 < 0x2b &&
       ((0x40100000401U >> ((ulong)uVar8 & 0x3f) & 1) != 0)))))) {
    *(byte *)&bdfface->face_flags = (byte)bdfface->face_flags | 4;
  }
  pbVar14 = bdf_get_font_property(font_00,"FAMILY_NAME");
  if ((pbVar14 == (bdf_property_t *)0x0) || ((pbVar14->value).atom == (char *)0x0)) {
    bdfface->family_name = (FT_String *)0x0;
  }
  else {
    pFVar15 = (FT_String *)ft_mem_strdup(memory_00,(pbVar14->value).atom,&local_e0);
    bdfface->family_name = pFVar15;
    if (local_e0 != 0) {
      return local_e0;
    }
  }
  local_e4 = 0;
  memory = bdfface->memory;
  font = (bdf_font_t *)bdfface[1].face_flags;
  local_b8 = (char *)0x0;
  pcStack_b0 = (char *)0x0;
  local_c8 = (undefined1  [8])0x0;
  pcStack_c0 = (char *)0x0;
  bdfface->style_flags = 0;
  pbVar14 = bdf_get_font_property(font,"SLANT");
  if ((((pbVar14 != (bdf_property_t *)0x0) && (pbVar14->format == 1)) &&
      ((byte *)(pbVar14->value).atom != (byte *)0x0)) &&
     ((uVar8 = (byte)*(pbVar14->value).atom - 0x49, uVar8 < 0x27 &&
      ((0x4100000041U >> ((ulong)uVar8 & 0x3f) & 1) != 0)))) {
    *(byte *)&bdfface->style_flags = (byte)bdfface->style_flags | 1;
    local_b8 = "Italic";
    if ((*(pbVar14->value).atom & 0xdfU) == 0x4f) {
      local_b8 = "Oblique";
    }
  }
  pbVar14 = bdf_get_font_property(font,"WEIGHT_NAME");
  if (((pbVar14 != (bdf_property_t *)0x0) && (pbVar14->format == 1)) &&
     (((byte *)(pbVar14->value).atom != (byte *)0x0 &&
      ((byte)(*(pbVar14->value).atom | 0x20U) == 0x62)))) {
    *(byte *)&bdfface->style_flags = (byte)bdfface->style_flags | 2;
    pcStack_c0 = "Bold";
  }
  pbVar14 = bdf_get_font_property(font,"SETWIDTH_NAME");
  if (((((pbVar14 != (bdf_property_t *)0x0) && (pbVar14->format == 1)) &&
       (pcVar16 = (pbVar14->value).atom, pcVar16 != (char *)0x0)) &&
      ((cVar1 = *pcVar16, cVar1 != '\0' && (cVar1 != 'N')))) && (cVar1 != 'n')) {
    pcStack_b0 = pcVar16;
  }
  pbVar14 = bdf_get_font_property(font,"ADD_STYLE_NAME");
  if (((pbVar14 != (bdf_property_t *)0x0) && (pbVar14->format == 1)) &&
     ((pFVar4 = (FT_Face)(pbVar14->value).atom, pFVar4 != (FT_Face)0x0 &&
      (((cVar1 = (char)pFVar4->num_faces, cVar1 != '\0' && (cVar1 != 'N')) && (cVar1 != 'n')))))) {
    local_c8 = (undefined1  [8])pFVar4;
  }
  FVar33 = 0;
  lVar32 = 0;
  do {
    local_88[lVar32] = 0;
    if (*(char **)(local_c8 + lVar32 * 8) != (char *)0x0) {
      sVar17 = strlen(*(char **)(local_c8 + lVar32 * 8));
      local_88[lVar32] = sVar17;
      FVar33 = FVar33 + sVar17 + 1;
    }
    lVar32 = lVar32 + 1;
  } while (lVar32 != 4);
  if (FVar33 == 0) {
    local_c8 = (undefined1  [8])0x18d577;
    local_88[0] = 7;
    FVar33 = 8;
  }
  pFVar15 = (FT_String *)ft_mem_alloc(memory,FVar33,&local_e4);
  bdfface->style_name = pFVar15;
  if (local_e4 != 0) {
    return local_e4;
  }
  lVar32 = 0;
  do {
    __src = *(void **)(local_c8 + lVar32 * 8);
    if (__src != (void *)0x0) {
      sVar17 = local_88[lVar32];
      if (pFVar15 != bdfface->style_name) {
        *pFVar15 = ' ';
        pFVar15 = pFVar15 + 1;
      }
      memcpy(pFVar15,__src,sVar17);
      if (((lVar32 == 3) || (lVar32 == 0)) && (sVar17 != 0)) {
        sVar18 = 0;
        do {
          if (pFVar15[sVar18] == ' ') {
            pFVar15[sVar18] = '-';
          }
          sVar18 = sVar18 + 1;
        } while (sVar17 != sVar18);
      }
      pFVar15 = pFVar15 + sVar17;
    }
    lVar32 = lVar32 + 1;
  } while (lVar32 != 4);
  *pFVar15 = '\0';
  local_e0 = local_e4;
  if (local_e4 != 0) {
    return local_e4;
  }
  bdfface->num_glyphs = font_00->glyphs_size + 1;
  bdfface->num_fixed_sizes = 1;
  pFVar19 = (FT_Bitmap_Size *)ft_mem_realloc(memory_00,0x20,0,1,(void *)0x0,&local_e0);
  bdfface->available_sizes = pFVar19;
  if (local_e0 != 0) {
    return local_e0;
  }
  pFVar19->x_ppem = 0;
  pFVar19->y_ppem = 0;
  pFVar19->height = 0;
  pFVar19->width = 0;
  *(undefined4 *)&pFVar19->field_0x4 = 0;
  pFVar19->size = 0;
  lVar32 = font_00->font_ascent;
  if (lVar32 - 0x8000U < 0xffffffffffff0001) {
    bVar35 = lVar32 < 0;
    lVar32 = 0x7fff;
    if (bVar35) {
      lVar32 = -0x7fff;
    }
    font_00->font_ascent = lVar32;
  }
  lVar23 = font_00->font_descent;
  if (lVar23 - 0x8000U < 0xffffffffffff0001) {
    bVar35 = lVar23 < 0;
    lVar23 = 0x7fff;
    if (bVar35) {
      lVar23 = -0x7fff;
    }
    font_00->font_descent = lVar23;
  }
  pFVar19->height = (short)lVar23 + (short)lVar32;
  pbVar14 = bdf_get_font_property(font_00,"AVERAGE_WIDTH");
  if (pbVar14 == (bdf_property_t *)0x0) {
    FVar33 = FT_MulDiv((long)pFVar19->height,2,3);
    FVar7 = (FT_Short)FVar33;
  }
  else {
    FVar7 = 0x7fff;
    if (0xfffffffffff6001c < (pbVar14->value).l - 0x4fff2U) {
      iVar10 = ((int)(pbVar14->value).l + 5) / 10;
      iVar9 = -iVar10;
      if (0 < iVar10) {
        iVar9 = iVar10;
      }
      FVar7 = (FT_Short)iVar9;
    }
  }
  pFVar19->width = FVar7;
  pbVar14 = bdf_get_font_property(font_00,"POINT_SIZE");
  if (pbVar14 == (bdf_property_t *)0x0) {
    uVar29 = font_00->point_size;
    if (uVar29 == 0) {
      FVar33 = (long)pFVar19->width << 6;
    }
    else {
      FVar33 = 0x7fff;
      if (uVar29 < 0x8000) {
        FVar33 = uVar29 << 6;
      }
    }
  }
  else {
    lVar32 = (pbVar14->value).l;
    FVar33 = 0x7fff;
    if (0xfffffffffff5f67a < lVar32 - 0x504c3U) {
      lVar23 = -lVar32;
      if (0 < lVar32) {
        lVar23 = lVar32;
      }
      FVar33 = FT_MulDiv(lVar23,0x70800,0x11a4e);
    }
  }
  pFVar19->size = FVar33;
  pbVar14 = bdf_get_font_property(font_00,"PIXEL_SIZE");
  if (pbVar14 != (bdf_property_t *)0x0) {
    iVar9 = (int)(pbVar14->value).l;
    iVar10 = -iVar9;
    if (0 < iVar9) {
      iVar10 = iVar9;
    }
    uVar29 = 0x1fffc0;
    if (0xffffffffffff0000 < (pbVar14->value).l - 0x8000U) {
      uVar29 = (ulong)(uint)(iVar10 << 6);
    }
    pFVar19->y_ppem = uVar29;
  }
  pbVar14 = bdf_get_font_property(font_00,"RESOLUTION_X");
  paVar24 = &pbVar14->value;
  if (pbVar14 == (bdf_property_t *)0x0) {
    paVar24 = (anon_union_8_3_ccdffb78_for_value *)&font_00->resolution_x;
  }
  lVar32 = paVar24->l;
  if (lVar32 == 0) {
    uVar26 = 0;
  }
  else {
    uVar26 = 0x7fff;
    if (0xffffffffffff0000 < lVar32 - 0x8000U) {
      uVar26 = -(ushort)lVar32;
      if (0 < (int)lVar32) {
        uVar26 = (ushort)lVar32;
      }
    }
  }
  pbVar14 = bdf_get_font_property(font_00,"RESOLUTION_Y");
  paVar24 = &pbVar14->value;
  if (pbVar14 == (bdf_property_t *)0x0) {
    paVar24 = (anon_union_8_3_ccdffb78_for_value *)&font_00->resolution_y;
  }
  uVar29 = paVar24->l;
  if (uVar29 == 0) {
    FVar33 = pFVar19->y_ppem;
    if (FVar33 == 0) {
      FVar33 = pFVar19->size;
      pFVar19->y_ppem = FVar33;
    }
  }
  else {
    if (uVar29 - 0x8000 < 0xffffffffffff0001) {
      FVar33 = pFVar19->y_ppem;
      uVar28 = 0x7fff;
      if (FVar33 == 0) {
        FVar33 = pFVar19->size;
        pFVar19->y_ppem = FVar33;
        uVar30 = 0x7fff;
LAB_0013b4c2:
        uVar28 = (ushort)uVar30;
        FVar33 = FT_MulDiv(FVar33,uVar30 & 0xffff,0x48);
        pFVar19->y_ppem = FVar33;
      }
    }
    else {
      iVar10 = (int)uVar29;
      uVar30 = (ulong)(uint)-iVar10;
      if (0 < iVar10) {
        uVar30 = uVar29 & 0xffffffff;
      }
      uVar28 = (ushort)uVar30;
      FVar33 = pFVar19->y_ppem;
      if (FVar33 == 0) {
        FVar33 = pFVar19->size;
        pFVar19->y_ppem = FVar33;
        if (iVar10 != 0) goto LAB_0013b4c2;
        goto LAB_0013b4ed;
      }
    }
    if ((uVar26 != 0) && (uVar28 != 0)) {
      FVar33 = FT_MulDiv(FVar33,(ulong)uVar26,(ulong)uVar28);
    }
  }
LAB_0013b4ed:
  pFVar19->x_ppem = FVar33;
  pbVar5 = font_00->glyphs;
  pvVar20 = ft_mem_realloc(memory_00,0x10,0,font_00->glyphs_size,(void *)0x0,&local_e0);
  bdfface[1].style_flags = (FT_Long)pvVar20;
  if (local_e0 != 0) {
    return local_e0;
  }
  bdfface[1].num_fixed_sizes = 0;
  uVar29 = font_00->glyphs_size;
  if (uVar29 != 0) {
    lVar32 = font_00->default_char;
    puVar25 = (undefined2 *)((long)pvVar20 + 8);
    plVar34 = &pbVar5->encoding;
    uVar30 = 0;
    do {
      lVar23 = *plVar34;
      *(long *)(puVar25 + -4) = lVar23;
      *puVar25 = (short)uVar30;
      if ((uVar30 < 0xffffffff) && (lVar23 == lVar32)) {
        bdfface[1].num_fixed_sizes = (FT_Int)uVar30;
      }
      uVar30 = uVar30 + 1;
      puVar25 = puVar25 + 8;
      plVar34 = plVar34 + 7;
    } while (uVar29 != uVar30);
  }
  pbVar14 = bdf_get_font_property(font_00,"CHARSET_REGISTRY");
  pbVar21 = bdf_get_font_property(font_00,"CHARSET_ENCODING");
  if ((((pbVar21 == (bdf_property_t *)0x0 || pbVar14 == (bdf_property_t *)0x0) ||
       (pbVar14->format != 1)) || (pbVar21->format != 1)) ||
     (((pbVar14->value).atom == (char *)0x0 || ((pbVar21->value).atom == (char *)0x0)))) {
    pcStack_c0 = (char *)0x741444f42;
    local_c8 = (undefined1  [8])bdfface;
    FVar11 = FT_CMap_New(&bdf_cmap_class,(FT_Pointer)0x0,(FT_CharMap)local_c8,
                         (FT_CMap_conflict *)0x0);
    if (bdfface->num_charmaps == 0) {
      return FVar11;
    }
    bdfface->charmap = *bdfface->charmaps;
    return FVar11;
  }
  pvVar20 = ft_mem_strdup(memory_00,(pbVar21->value).atom,&local_e0);
  bdfface[1].num_faces = (FT_Long)pvVar20;
  if (local_e0 != 0) {
    return local_e0;
  }
  pbVar22 = (byte *)ft_mem_strdup(memory_00,(pbVar14->value).atom,&local_e0);
  bdfface[1].face_index = (FT_Long)pbVar22;
  if (local_e0 != 0) {
    return local_e0;
  }
  if ((((*pbVar22 | 0x20) == 0x69) && ((pbVar22[1] | 0x20) == 0x73)) &&
     ((pbVar22[2] | 0x20) == 0x6f)) {
    pbVar22 = pbVar22 + 3;
    iVar10 = strcmp((char *)pbVar22,"10646");
    if ((iVar10 != 0) &&
       (((iVar10 = strcmp((char *)pbVar22,"8859"), iVar10 != 0 ||
         (*(char *)bdfface[1].num_faces != '1')) || (((char *)bdfface[1].num_faces)[1] != '\0')))) {
      iVar10 = strcmp((char *)pbVar22,"646.1991");
      if (iVar10 != 0) goto LAB_0013b6c4;
      iVar10 = strcmp((char *)bdfface[1].num_faces,"IRV");
      pcStack_c0 = (char *)0x0;
      if (iVar10 != 0) goto LAB_0013b6d2;
    }
    pcStack_c0 = (char *)0x10003756e6963;
  }
  else {
LAB_0013b6c4:
    pcStack_c0 = (char *)0x0;
  }
LAB_0013b6d2:
  local_c8 = (undefined1  [8])bdfface;
  FVar11 = FT_CMap_New(&bdf_cmap_class,(FT_Pointer)0x0,(FT_CharMap)local_c8,(FT_CMap_conflict *)0x0)
  ;
  return FVar11;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  BDF_Face_Init( FT_Stream      stream,
                 FT_Face        bdfface,        /* BDF_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    FT_Error       error  = FT_Err_Ok;
    BDF_Face       face   = (BDF_Face)bdfface;
    FT_Memory      memory = FT_FACE_MEMORY( face );

    bdf_font_t*    font = NULL;
    bdf_options_t  options;

    FT_UNUSED( num_params );
    FT_UNUSED( params );


    FT_TRACE2(( "BDF driver\n" ));

    if ( FT_STREAM_SEEK( 0 ) )
      goto Exit;

    options.correct_metrics = 1;   /* FZ XXX: options semantics */
    options.keep_unencoded  = 1;
    options.keep_comments   = 0;
    options.font_spacing    = BDF_PROPORTIONAL;

    error = bdf_load_font( stream, memory, &options, &font );
    if ( FT_ERR_EQ( error, Missing_Startfont_Field ) )
    {
      FT_TRACE2(( "  not a BDF file\n" ));
      goto Fail;
    }
    else if ( error )
      goto Exit;

    /* we have a bdf font: let's construct the face object */
    face->bdffont = font;

    /* BDF cannot have multiple faces in a single font file.
     * XXX: non-zero face_index is already invalid argument, but
     *      Type1, Type42 driver has a convention to return
     *      an invalid argument error when the font could be
     *      opened by the specified driver.
     */
    if ( face_index > 0 && ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "BDF_Face_Init: invalid face index\n" ));
      BDF_Face_Done( bdfface );
      return FT_THROW( Invalid_Argument );
    }

    {
      bdf_property_t*  prop = NULL;


      FT_TRACE4(( "  number of glyphs: allocated %d (used %d)\n",
                  font->glyphs_size,
                  font->glyphs_used ));
      FT_TRACE4(( "  number of unencoded glyphs: allocated %d (used %d)\n",
                  font->unencoded_size,
                  font->unencoded_used ));

      bdfface->num_faces  = 1;
      bdfface->face_index = 0;

      bdfface->face_flags |= FT_FACE_FLAG_FIXED_SIZES |
                             FT_FACE_FLAG_HORIZONTAL  |
                             FT_FACE_FLAG_FAST_GLYPHS;

      prop = bdf_get_font_property( font, "SPACING" );
      if ( prop && prop->format == BDF_ATOM                             &&
           prop->value.atom                                             &&
           ( *(prop->value.atom) == 'M' || *(prop->value.atom) == 'm' ||
             *(prop->value.atom) == 'C' || *(prop->value.atom) == 'c' ) )
        bdfface->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      /* FZ XXX: TO DO: FT_FACE_FLAGS_VERTICAL   */
      /* FZ XXX: I need a font to implement this */

      prop = bdf_get_font_property( font, "FAMILY_NAME" );
      if ( prop && prop->value.atom )
      {
        if ( FT_STRDUP( bdfface->family_name, prop->value.atom ) )
          goto Exit;
      }
      else
        bdfface->family_name = NULL;

      if ( FT_SET_ERROR( bdf_interpret_style( face ) ) )
        goto Exit;

      /* the number of glyphs (with one slot for the undefined glyph */
      /* at position 0 and all unencoded glyphs)                     */
      bdfface->num_glyphs = (FT_Long)( font->glyphs_size + 1 );

      bdfface->num_fixed_sizes = 1;
      if ( FT_NEW_ARRAY( bdfface->available_sizes, 1 ) )
        goto Exit;

      {
        FT_Bitmap_Size*  bsize = bdfface->available_sizes;
        FT_Short         resolution_x = 0, resolution_y = 0;
        long             value;


        FT_ZERO( bsize );

        /* sanity checks */
        if ( font->font_ascent > 0x7FFF || font->font_ascent < -0x7FFF )
        {
          font->font_ascent = font->font_ascent < 0 ? -0x7FFF : 0x7FFF;
          FT_TRACE0(( "BDF_Face_Init: clamping font ascent to value %d\n",
                      font->font_ascent ));
        }
        if ( font->font_descent > 0x7FFF || font->font_descent < -0x7FFF )
        {
          font->font_descent = font->font_descent < 0 ? -0x7FFF : 0x7FFF;
          FT_TRACE0(( "BDF_Face_Init: clamping font descent to value %d\n",
                      font->font_descent ));
        }

        bsize->height = (FT_Short)( font->font_ascent + font->font_descent );

        prop = bdf_get_font_property( font, "AVERAGE_WIDTH" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative average width\n" ));
#endif
          if ( prop->value.l >    0x7FFFL * 10 - 5   ||
               prop->value.l < -( 0x7FFFL * 10 - 5 ) )
          {
            bsize->width = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping average width to value %d\n",
                        bsize->width ));
          }
          else
            bsize->width = FT_ABS( (FT_Short)( ( prop->value.l + 5 ) / 10 ) );
        }
        else
        {
          /* this is a heuristical value */
          bsize->width = (FT_Short)FT_MulDiv( bsize->height, 2, 3 );
        }

        prop = bdf_get_font_property( font, "POINT_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative point size\n" ));
#endif
          /* convert from 722.7 decipoints to 72 points per inch */
          if ( prop->value.l >  0x504C2L || /* 0x7FFF * 72270/7200 */
               prop->value.l < -0x504C2L )
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping point size to value %d\n",
                        bsize->size ));
          }
          else
            bsize->size = FT_MulDiv( FT_ABS( prop->value.l ),
                                     64 * 7200,
                                     72270L );
        }
        else if ( font->point_size )
        {
          if ( font->point_size > 0x7FFF )
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping point size to value %d\n",
                        bsize->size ));
          }
          else
            bsize->size = (FT_Pos)font->point_size << 6;
        }
        else
        {
          /* this is a heuristical value */
          bsize->size = bsize->width * 64;
        }

        prop = bdf_get_font_property( font, "PIXEL_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative pixel size\n" ));
#endif
          if ( prop->value.l > 0x7FFF || prop->value.l < -0x7FFF )
          {
            bsize->y_ppem = 0x7FFF << 6;
            FT_TRACE0(( "BDF_Face_Init: clamping pixel size to value %d\n",
                        bsize->y_ppem ));
          }
          else
            bsize->y_ppem = FT_ABS( (FT_Short)prop->value.l ) << 6;
        }

        prop = bdf_get_font_property( font, "RESOLUTION_X" );
        if ( prop )
          value = prop->value.l;
        else
          value = (long)font->resolution_x;
        if ( value )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( value < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative X resolution\n" ));
#endif
          if ( value > 0x7FFF || value < -0x7FFF )
          {
            resolution_x = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping X resolution to value %d\n",
                        resolution_x ));
          }
          else
            resolution_x = FT_ABS( (FT_Short)value );
        }

        prop = bdf_get_font_property( font, "RESOLUTION_Y" );
        if ( prop )
          value = prop->value.l;
        else
          value = (long)font->resolution_y;
        if ( value )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( value < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative Y resolution\n" ));
#endif
          if ( value > 0x7FFF || value < -0x7FFF )
          {
            resolution_y = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping Y resolution to value %d\n",
                        resolution_y ));
          }
          else
            resolution_y = FT_ABS( (FT_Short)value );
        }

        if ( bsize->y_ppem == 0 )
        {
          bsize->y_ppem = bsize->size;
          if ( resolution_y )
            bsize->y_ppem = FT_MulDiv( bsize->y_ppem, resolution_y, 72 );
        }
        if ( resolution_x && resolution_y )
          bsize->x_ppem = FT_MulDiv( bsize->y_ppem,
                                     resolution_x,
                                     resolution_y );
        else
          bsize->x_ppem = bsize->y_ppem;
      }

      /* encoding table */
      {
        bdf_glyph_t*   cur = font->glyphs;
        unsigned long  n;


        if ( FT_NEW_ARRAY( face->en_table, font->glyphs_size ) )
          goto Exit;

        face->default_glyph = 0;
        for ( n = 0; n < font->glyphs_size; n++ )
        {
          (face->en_table[n]).enc = cur[n].encoding;
          FT_TRACE4(( "  idx %d, val 0x%lX\n", n, cur[n].encoding ));
          (face->en_table[n]).glyph = (FT_UShort)n;

          if ( cur[n].encoding == font->default_char )
          {
            if ( n < FT_UINT_MAX )
              face->default_glyph = (FT_UInt)n;
            else
              FT_TRACE1(( "BDF_Face_Init:"
                          " idx %d is too large for this system\n", n ));
          }
        }
      }

      /* charmaps */
      {
        bdf_property_t  *charset_registry, *charset_encoding;
        FT_Bool          unicode_charmap  = 0;


        charset_registry =
          bdf_get_font_property( font, "CHARSET_REGISTRY" );
        charset_encoding =
          bdf_get_font_property( font, "CHARSET_ENCODING" );
        if ( charset_registry && charset_encoding )
        {
          if ( charset_registry->format == BDF_ATOM &&
               charset_encoding->format == BDF_ATOM &&
               charset_registry->value.atom         &&
               charset_encoding->value.atom         )
          {
            const char*  s;


            if ( FT_STRDUP( face->charset_encoding,
                            charset_encoding->value.atom ) ||
                 FT_STRDUP( face->charset_registry,
                            charset_registry->value.atom ) )
              goto Exit;

            /* Uh, oh, compare first letters manually to avoid dependency */
            /* on locales.                                                */
            s = face->charset_registry;
            if ( ( s[0] == 'i' || s[0] == 'I' ) &&
                 ( s[1] == 's' || s[1] == 'S' ) &&
                 ( s[2] == 'o' || s[2] == 'O' ) )
            {
              s += 3;
              if ( !ft_strcmp( s, "10646" )                      ||
                   ( !ft_strcmp( s, "8859" ) &&
                     !ft_strcmp( face->charset_encoding, "1" ) ) )
                unicode_charmap = 1;
              /* another name for ASCII */
              else if ( !ft_strcmp( s, "646.1991" )                 &&
                        !ft_strcmp( face->charset_encoding, "IRV" ) )
                unicode_charmap = 1;
            }

            {
              FT_CharMapRec  charmap;


              charmap.face        = FT_FACE( face );
              charmap.encoding    = FT_ENCODING_NONE;
              /* initial platform/encoding should indicate unset status? */
              charmap.platform_id = TT_PLATFORM_APPLE_UNICODE;
              charmap.encoding_id = TT_APPLE_ID_DEFAULT;

              if ( unicode_charmap )
              {
                charmap.encoding    = FT_ENCODING_UNICODE;
                charmap.platform_id = TT_PLATFORM_MICROSOFT;
                charmap.encoding_id = TT_MS_ID_UNICODE_CS;
              }

              error = FT_CMap_New( &bdf_cmap_class, NULL, &charmap, NULL );
            }

            goto Exit;
          }
        }

        /* otherwise assume Adobe standard encoding */

        {
          FT_CharMapRec  charmap;


          charmap.face        = FT_FACE( face );
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.platform_id = TT_PLATFORM_ADOBE;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;

          error = FT_CMap_New( &bdf_cmap_class, NULL, &charmap, NULL );

          /* Select default charmap */
          if ( bdfface->num_charmaps )
            bdfface->charmap = bdfface->charmaps[0];
        }
      }
    }

  Exit:
    return error;

  Fail:
    BDF_Face_Done( bdfface );
    return FT_THROW( Unknown_File_Format );
  }